

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O1

void duckdb::InSearchPathFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  idx_t count;
  undefined8 uVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  ClientContext *pCVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  bool bVar12;
  ClientContext *context;
  ClientData *pCVar13;
  unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
  *this_00;
  reference vector;
  reference vector_00;
  idx_t iVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  ulong uVar16;
  idx_t iVar17;
  long lVar18;
  idx_t idx_in_entry;
  idx_t iVar19;
  data_ptr_t pdVar20;
  ulong uVar21;
  unsigned_long uVar22;
  ulong uVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  ulong uVar26;
  ulong uVar27;
  anon_class_16_2_9a274d3c fun;
  anon_class_16_2_9a274d3c fun_00;
  anon_class_16_2_9a274d3c fun_01;
  anon_class_16_2_9a274d3c fun_02;
  anon_class_16_2_9a274d3c fun_03;
  anon_class_16_2_9a274d3c fun_04;
  anon_class_16_2_9a274d3c fun_05;
  anon_class_16_2_9a274d3c fun_06;
  anon_class_16_2_9a274d3c fun_07;
  anon_class_16_2_9a274d3c fun_08;
  anon_class_16_2_9a274d3c fun_09;
  anon_class_16_2_9a274d3c fun_10;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  UnifiedVectorFormat ldata;
  undefined8 in_stack_fffffffffffffee8;
  ValidityMask *pVVar28;
  undefined8 in_stack_fffffffffffffef0;
  data_ptr_t pdVar29;
  data_ptr_t pdVar30;
  idx_t in_stack_fffffffffffffef8;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  context = ExpressionState::GetContext(state);
  pCVar13 = ClientData::Get(context);
  this_00 = &pCVar13->catalog_search_path;
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar25 = result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      right.value.pointer.ptr = (char *)in_stack_fffffffffffffef0;
      right.value._0_8_ = in_stack_fffffffffffffee8;
      fun.context = *(ClientContext **)vector->data;
      fun.search_path =
           (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
            *)context;
      left.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
      left.value._0_8_ = *(undefined8 *)(vector->data + 8);
      bVar12 = BinaryLambdaWrapper::
               Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                         ((BinaryLambdaWrapper *)this_00,fun,left,right,
                          *(ValidityMask **)(vector_00->data + 8),in_stack_fffffffffffffef8);
      *pdVar25 = bVar12;
      return;
    }
  }
  else {
    count = input->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar25 = vector->data;
      pdVar29 = vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar30 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          uVar5 = *(undefined8 *)pdVar29;
          pVVar28 = *(ValidityMask **)(pdVar29 + 8);
          pdVar25 = pdVar25 + 8;
          iVar17 = 0;
          do {
            right_05.value.pointer.ptr = (char *)pdVar29;
            right_05.value._0_8_ = pdVar25;
            fun_05.context = *(ClientContext **)(pdVar25 + -8);
            fun_05.search_path =
                 (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)context;
            left_05.value.pointer.ptr = (char *)uVar5;
            left_05.value._0_8_ = *(undefined8 *)pdVar25;
            bVar12 = BinaryLambdaWrapper::
                     Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                               ((BinaryLambdaWrapper *)this_00,fun_05,left_05,right_05,pVVar28,
                                (idx_t)pdVar30);
            pdVar30[iVar17] = bVar12;
            iVar17 = iVar17 + 1;
            pdVar25 = pdVar25 + 0x10;
          } while (count != iVar17);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        pdVar25 = pdVar25 + 8;
        uVar26 = 0;
        uVar24 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar22 = 0xffffffffffffffff;
          }
          else {
            uVar22 = puVar4[uVar26];
          }
          uVar16 = uVar24 + 0x40;
          if (count <= uVar24 + 0x40) {
            uVar16 = count;
          }
          uVar23 = uVar16;
          if (uVar22 != 0) {
            uVar23 = uVar24;
            if (uVar22 == 0xffffffffffffffff) {
              if (uVar24 < uVar16) {
                uVar5 = *(undefined8 *)pdVar29;
                pVVar28 = *(ValidityMask **)(pdVar29 + 8);
                pdVar20 = pdVar25 + uVar24 * 0x10;
                do {
                  right_00.value.pointer.ptr = (char *)pdVar29;
                  right_00.value._0_8_ = pdVar25;
                  fun_00.context = *(ClientContext **)(pdVar20 + -8);
                  fun_00.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)context;
                  left_00.value.pointer.ptr = (char *)uVar5;
                  left_00.value._0_8_ = *(undefined8 *)pdVar20;
                  bVar12 = BinaryLambdaWrapper::
                           Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                     ((BinaryLambdaWrapper *)this_00,fun_00,left_00,right_00,pVVar28
                                      ,(idx_t)pdVar30);
                  pdVar30[uVar23] = bVar12;
                  uVar23 = uVar23 + 1;
                  pdVar20 = pdVar20 + 0x10;
                } while (uVar16 != uVar23);
              }
            }
            else if (uVar24 < uVar16) {
              pdVar20 = pdVar25 + uVar24 * 0x10;
              uVar21 = 0;
              do {
                if ((uVar22 >> (uVar21 & 0x3f) & 1) != 0) {
                  right_01.value.pointer.ptr = (char *)pdVar29;
                  right_01.value._0_8_ = pdVar25;
                  fun_01.context = *(ClientContext **)(pdVar20 + -8);
                  fun_01.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)context;
                  left_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar29;
                  left_01.value._0_8_ = *(undefined8 *)pdVar20;
                  bVar12 = BinaryLambdaWrapper::
                           Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                     ((BinaryLambdaWrapper *)this_00,fun_01,left_01,right_01,
                                      *(ValidityMask **)(pdVar29 + 8),(idx_t)pdVar30);
                  pdVar30[uVar24] = bVar12;
                }
                uVar24 = uVar24 + 1;
                pdVar20 = pdVar20 + 0x10;
                uVar21 = uVar21 + 1;
                uVar23 = uVar24;
              } while (uVar16 != uVar24);
            }
          }
          uVar26 = uVar26 + 1;
          uVar24 = uVar23;
        } while (uVar26 != count + 0x3f >> 6);
        return;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar25 = vector->data;
          pdVar29 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar30 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar28 = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(pVVar28,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar18 = 8;
              iVar17 = 0;
              do {
                right_10.value.pointer.ptr = (char *)pdVar30;
                right_10.value._0_8_ = pVVar28;
                fun_10.context = *(ClientContext **)(pdVar25 + lVar18 + -8);
                fun_10.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)context;
                left_10.value.pointer.ptr = (char *)*(undefined8 *)(pdVar29 + lVar18 + -8);
                left_10.value._0_8_ = *(undefined8 *)(pdVar25 + lVar18);
                bVar12 = BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   ((BinaryLambdaWrapper *)this_00,fun_10,left_10,right_10,
                                    *(ValidityMask **)(pdVar29 + lVar18),(idx_t)pdVar25);
                pdVar30[iVar17] = bVar12;
                iVar17 = iVar17 + 1;
                lVar18 = lVar18 + 0x10;
              } while (count != iVar17);
            }
          }
          else if (0x3f < count + 0x3f) {
            uVar26 = 0;
            uVar24 = 0;
            do {
              puVar4 = (pVVar28->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar22 = 0xffffffffffffffff;
              }
              else {
                uVar22 = puVar4[uVar26];
              }
              uVar16 = uVar24 + 0x40;
              if (count <= uVar24 + 0x40) {
                uVar16 = count;
              }
              uVar23 = uVar16;
              if (uVar22 != 0) {
                uVar23 = uVar24;
                if (uVar22 == 0xffffffffffffffff) {
                  if (uVar24 < uVar16) {
                    uVar24 = uVar24 << 4 | 8;
                    do {
                      right_06.value.pointer.ptr = (char *)pdVar30;
                      right_06.value._0_8_ = pVVar28;
                      fun_06.context = *(ClientContext **)(pdVar25 + (uVar24 - 8));
                      fun_06.search_path =
                           (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                            *)context;
                      left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar29 + (uVar24 - 8));
                      left_06.value._0_8_ = *(undefined8 *)(pdVar25 + uVar24);
                      bVar12 = BinaryLambdaWrapper::
                               Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                         ((BinaryLambdaWrapper *)this_00,fun_06,left_06,right_06,
                                          *(ValidityMask **)(pdVar29 + uVar24),(idx_t)pdVar25);
                      pdVar30[uVar23] = bVar12;
                      uVar23 = uVar23 + 1;
                      uVar24 = uVar24 + 0x10;
                    } while (uVar16 != uVar23);
                  }
                }
                else if (uVar24 < uVar16) {
                  uVar21 = uVar24 << 4 | 8;
                  uVar27 = 0;
                  do {
                    if ((uVar22 >> (uVar27 & 0x3f) & 1) != 0) {
                      right_07.value.pointer.ptr = (char *)pdVar30;
                      right_07.value._0_8_ = pVVar28;
                      fun_07.context = *(ClientContext **)(pdVar25 + (uVar21 - 8));
                      fun_07.search_path =
                           (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                            *)context;
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(pdVar29 + (uVar21 - 8));
                      left_07.value._0_8_ = *(undefined8 *)(pdVar25 + uVar21);
                      bVar12 = BinaryLambdaWrapper::
                               Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                         ((BinaryLambdaWrapper *)this_00,fun_07,left_07,right_07,
                                          *(ValidityMask **)(pdVar29 + uVar21),(idx_t)pdVar25);
                      pdVar30[uVar24] = bVar12;
                    }
                    uVar24 = uVar24 + 1;
                    uVar21 = uVar21 + 0x10;
                    uVar27 = uVar27 + 1;
                    uVar23 = uVar24;
                  } while (uVar16 != uVar24);
                }
              }
              uVar26 = uVar26 + 1;
              uVar24 = uVar23;
            } while (uVar26 != count + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&local_78);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar25 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar6 = (local_78.sel)->sel_vector;
              psVar7 = (local_c0.sel)->sel_vector;
              iVar17 = 0;
              pdVar29 = local_78.data;
              do {
                iVar14 = iVar17;
                if (psVar6 != (sel_t *)0x0) {
                  iVar14 = (idx_t)psVar6[iVar17];
                }
                iVar19 = iVar17;
                if (psVar7 != (sel_t *)0x0) {
                  iVar19 = (idx_t)psVar7[iVar17];
                }
                right_02.value.pointer.ptr = (char *)pdVar25;
                right_02.value._0_8_ = in_stack_fffffffffffffee8;
                fun_02.context = *(ClientContext **)(pdVar29 + iVar14 * 0x10);
                fun_02.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)context;
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar19 * 0x10);
                left_02.value._0_8_ = *(undefined8 *)(pdVar29 + iVar14 * 0x10 + 8);
                bVar12 = BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   ((BinaryLambdaWrapper *)this_00,fun_02,left_02,right_02,
                                    *(ValidityMask **)(local_c0.data + iVar19 * 0x10 + 8),
                                    (idx_t)pdVar29);
                pdVar25[iVar17] = bVar12;
                iVar17 = iVar17 + 1;
              } while (count != iVar17);
            }
          }
          else if (count != 0) {
            psVar6 = (local_78.sel)->sel_vector;
            psVar7 = (local_c0.sel)->sel_vector;
            uVar24 = 0;
            pdVar29 = local_78.data;
            do {
              uVar26 = uVar24;
              if (psVar6 != (sel_t *)0x0) {
                uVar26 = (ulong)psVar6[uVar24];
              }
              uVar16 = uVar24;
              if (psVar7 != (sel_t *)0x0) {
                uVar16 = (ulong)psVar7[uVar24];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar26 >> 6] >> (uVar26 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)))) {
                right_08.value.pointer.ptr = (char *)pdVar25;
                right_08.value._0_8_ = in_stack_fffffffffffffee8;
                fun_08.context = *(ClientContext **)(pdVar29 + uVar26 * 0x10);
                fun_08.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)context;
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar16 * 0x10);
                left_08.value._0_8_ = *(undefined8 *)(pdVar29 + uVar26 * 0x10 + 8);
                bVar12 = BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   ((BinaryLambdaWrapper *)this_00,fun_08,left_08,right_08,
                                    *(ValidityMask **)(local_c0.data + uVar16 * 0x10 + 8),
                                    (idx_t)pdVar29);
                pdVar25[uVar24] = bVar12;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var11 = p_Stack_d0;
                  peVar10 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar10;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var11;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar15->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar9 = (byte)uVar24 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar24 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              uVar24 = uVar24 + 1;
            } while (count != uVar24);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar29 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar30 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          pCVar8 = *(ClientContext **)pdVar29;
          uVar5 = *(undefined8 *)(pdVar29 + 8);
          pdVar25 = pdVar25 + 8;
          iVar17 = 0;
          do {
            right_09.value.pointer.ptr = (char *)pdVar29;
            right_09.value._0_8_ = pdVar25;
            fun_09.context = pCVar8;
            fun_09.search_path =
                 (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)context;
            left_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + -8);
            left_09.value._0_8_ = uVar5;
            bVar12 = BinaryLambdaWrapper::
                     Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                               ((BinaryLambdaWrapper *)this_00,fun_09,left_09,right_09,
                                *(ValidityMask **)pdVar25,(idx_t)pdVar30);
            pdVar30[iVar17] = bVar12;
            iVar17 = iVar17 + 1;
            pdVar25 = pdVar25 + 0x10;
          } while (count != iVar17);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        pdVar25 = pdVar25 + 8;
        uVar26 = 0;
        uVar24 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar22 = 0xffffffffffffffff;
          }
          else {
            uVar22 = puVar4[uVar26];
          }
          uVar16 = uVar24 + 0x40;
          if (count <= uVar24 + 0x40) {
            uVar16 = count;
          }
          uVar23 = uVar16;
          if (uVar22 != 0) {
            uVar23 = uVar24;
            if (uVar22 == 0xffffffffffffffff) {
              if (uVar24 < uVar16) {
                pCVar8 = *(ClientContext **)pdVar29;
                uVar5 = *(undefined8 *)(pdVar29 + 8);
                pdVar20 = pdVar25 + uVar24 * 0x10;
                do {
                  right_03.value.pointer.ptr = (char *)pdVar29;
                  right_03.value._0_8_ = pdVar25;
                  fun_03.context = pCVar8;
                  fun_03.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)context;
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + -8);
                  left_03.value._0_8_ = uVar5;
                  bVar12 = BinaryLambdaWrapper::
                           Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                     ((BinaryLambdaWrapper *)this_00,fun_03,left_03,right_03,
                                      *(ValidityMask **)pdVar20,(idx_t)pdVar30);
                  pdVar30[uVar23] = bVar12;
                  uVar23 = uVar23 + 1;
                  pdVar20 = pdVar20 + 0x10;
                } while (uVar16 != uVar23);
              }
            }
            else if (uVar24 < uVar16) {
              pdVar20 = pdVar25 + uVar24 * 0x10;
              uVar21 = 0;
              do {
                if ((uVar22 >> (uVar21 & 0x3f) & 1) != 0) {
                  right_04.value.pointer.ptr = (char *)pdVar29;
                  right_04.value._0_8_ = pdVar25;
                  fun_04.context = *(ClientContext **)pdVar29;
                  fun_04.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)context;
                  left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar20 + -8);
                  left_04.value._0_8_ = *(undefined8 *)(pdVar29 + 8);
                  bVar12 = BinaryLambdaWrapper::
                           Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                     ((BinaryLambdaWrapper *)this_00,fun_04,left_04,right_04,
                                      *(ValidityMask **)pdVar20,(idx_t)pdVar30);
                  pdVar30[uVar24] = bVar12;
                }
                uVar24 = uVar24 + 1;
                pdVar20 = pdVar20 + 0x10;
                uVar21 = uVar21 + 1;
                uVar23 = uVar24;
              } while (uVar16 != uVar24);
            }
          }
          uVar26 = uVar26 + 1;
          uVar24 = uVar23;
        } while (uVar26 != count + 0x3f >> 6);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void InSearchPathFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	auto &search_path = ClientData::Get(context).catalog_search_path;
	BinaryExecutor::Execute<string_t, string_t, bool>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t db_name, string_t schema_name) {
		    return search_path->SchemaInSearchPath(context, db_name.GetString(), schema_name.GetString());
	    });
}